

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void NV21ToYUV24Row_C(uint8_t *src_y,uint8_t *src_vu,uint8_t *dst_yuv24,int width)

{
  int x;
  int width_local;
  uint8_t *dst_yuv24_local;
  uint8_t *src_vu_local;
  uint8_t *src_y_local;
  
  dst_yuv24_local = dst_yuv24;
  src_vu_local = src_vu;
  src_y_local = src_y;
  for (x = 0; x < width + -1; x = x + 2) {
    *dst_yuv24_local = *src_vu_local;
    dst_yuv24_local[1] = src_vu_local[1];
    dst_yuv24_local[2] = *src_y_local;
    dst_yuv24_local[3] = *src_vu_local;
    dst_yuv24_local[4] = src_vu_local[1];
    dst_yuv24_local[5] = src_y_local[1];
    src_y_local = src_y_local + 2;
    src_vu_local = src_vu_local + 2;
    dst_yuv24_local = dst_yuv24_local + 6;
  }
  if ((width & 1U) != 0) {
    *dst_yuv24_local = *src_vu_local;
    dst_yuv24_local[1] = src_vu_local[1];
    dst_yuv24_local[2] = *src_y_local;
  }
  return;
}

Assistant:

void NV21ToYUV24Row_C(const uint8_t* src_y,
                      const uint8_t* src_vu,
                      uint8_t* dst_yuv24,
                      int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_yuv24[0] = src_vu[0];  // V
    dst_yuv24[1] = src_vu[1];  // U
    dst_yuv24[2] = src_y[0];   // Y0
    dst_yuv24[3] = src_vu[0];  // V
    dst_yuv24[4] = src_vu[1];  // U
    dst_yuv24[5] = src_y[1];   // Y1
    src_y += 2;
    src_vu += 2;
    dst_yuv24 += 6;  // Advance 2 pixels.
  }
  if (width & 1) {
    dst_yuv24[0] = src_vu[0];  // V
    dst_yuv24[1] = src_vu[1];  // U
    dst_yuv24[2] = src_y[0];   // Y0
  }
}